

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  uint in_EDX;
  float *in_RSI;
  long in_RDI;
  bool local_15;
  
  if ((in_EDX == 0) || ((*(uint *)(in_RDI + 0xa8) & in_EDX) != 0)) {
    local_15 = true;
    if (in_EDX != 0) {
      local_15 = ImIsPowerOfTwo(in_EDX);
    }
    if (local_15 == false) {
      __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x192d,"void ImGui::SetWindowSize(ImGuiWindow *, const ImVec2 &, ImGuiCond)");
    }
    *(uint *)(in_RDI + 0xa8) = *(uint *)(in_RDI + 0xa8) & 0xfffffff1;
    if (*in_RSI <= 0.0) {
      *(undefined1 *)(in_RDI + 0x94) = 2;
      *(undefined1 *)(in_RDI + 0x97) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x94) = 0;
      *(float *)(in_RDI + 0x20) = (float)(int)*in_RSI;
    }
    if (in_RSI[1] <= 0.0) {
      *(undefined1 *)(in_RDI + 0x95) = 2;
      *(undefined1 *)(in_RDI + 0x97) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x95) = 0;
      *(float *)(in_RDI + 0x24) = (float)(int)in_RSI[1];
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    if (size.x > 0.0f)
    {
        window->AutoFitFramesX = 0;
        window->SizeFull.x = IM_FLOOR(size.x);
    }
    else
    {
        window->AutoFitFramesX = 2;
        window->AutoFitOnlyGrows = false;
    }
    if (size.y > 0.0f)
    {
        window->AutoFitFramesY = 0;
        window->SizeFull.y = IM_FLOOR(size.y);
    }
    else
    {
        window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
}